

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<long_double>_>::PrepareZ
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *y,
          TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *beta,int opt)

{
  longdouble lVar1;
  long lVar2;
  Fad<long_double> *pFVar3;
  long col;
  long lVar4;
  size_t sVar5;
  int64_t i;
  long lVar6;
  long row;
  Fad<long_double> local_68;
  
  lVar2 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(z,lVar2,lVar6);
  col = 0;
  lVar4 = lVar2;
  if (lVar2 < 1) {
    lVar4 = col;
  }
  if (lVar6 < 1) {
    lVar6 = col;
  }
  for (; col != lVar6; col = col + 1) {
    pFVar3 = TPZFMatrix<Fad<long_double>_>::operator()(z,0,col);
    local_68.val_ = (longdouble)0;
    local_68.dx_.num_elts = 0;
    local_68.dx_.ptr_to_data = (longdouble *)0x0;
    local_68.defaultVal._0_8_ = 0;
    local_68.defaultVal._8_2_ = 0;
    lVar1 = beta->val_;
    Fad<long_double>::~Fad(&local_68);
    if ((lVar1 != (longdouble)0) || (sVar5 = lVar2 * 0x30, NAN(lVar1) || NAN((longdouble)0))) {
      if (z != y) {
        memcpy(pFVar3,y->fElem +
                      (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow * col,
               lVar2 * 0x30);
      }
      for (row = 0; lVar4 != row; row = row + 1) {
        pFVar3 = TPZFMatrix<Fad<long_double>_>::operator()(z,row,col);
        Fad<long_double>::operator*=<long_double,_nullptr>(pFVar3,beta);
      }
    }
    else {
      for (; sVar5 != 0; sVar5 = sVar5 - 0x30) {
        local_68.val_ = (longdouble)((unkuint10)local_68.val_._8_2_ << 0x40);
        Fad<long_double>::operator=<double,_nullptr>(pFVar3,(double *)&local_68);
        pFVar3 = pFVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}